

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::BinaryWriter::writeRaw(BinaryWriter *this,void *ptr,size_t size)

{
  uchar *in_RSI;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  const_iterator in_stack_00000008;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *__first;
  
  __first = in_RDI;
  std::
  stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
  ::top((stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
         *)0x119492);
  std::__shared_ptr_access<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x11949a);
  std::
  stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
  ::top((stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
         *)0x1194a9);
  std::__shared_ptr_access<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1194b1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffffb8);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (in_RDI,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_ffffffffffffffb8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            (unaff_retaddr,in_stack_00000008,(uchar *)__first,in_RSI);
  return;
}

Assistant:

void writeRaw(const void *ptr, size_t size)
    {
      assert(ptr);
      serializedEntity.top()->insert(serializedEntity.top()->end(),(uint8_t*)ptr,(uint8_t*)ptr + size);
    }